

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

statement_base * __thiscall
cs::method_var::translate
          (method_var *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  statement_base *psVar1;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *this_00;
  shared_ptr<cs::context_type> *in_stack_ffffffffffffff98;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_ffffffffffffffa0;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_ffffffffffffffb0;
  element_type *in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffcf;
  context_t *in_stack_ffffffffffffffd0;
  tree_type<cs::token_base_*> *in_stack_ffffffffffffffd8;
  statement_var *in_stack_ffffffffffffffe0;
  
  psVar1 = (statement_base *)statement_base::operator_new((size_t)in_stack_ffffffffffffffa0);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front(in_stack_ffffffffffffffb0);
  this_00 = (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
            std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      (in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
  token_expr::get_tree
            ((token_expr *)
             (((_Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                *)&this_00->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
             ->_M_impl).super__Deque_impl_data._M_map);
  tree_type<cs::token_base_*>::tree_type
            ((tree_type<cs::token_base_*> *)in_stack_ffffffffffffffa0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffff98);
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)&stack0xffffffffffffffc0,in_stack_ffffffffffffff98);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)this_00);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back(this_00);
  statement_var::statement_var
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             (bool)in_stack_ffffffffffffffcf,(token_base *)in_stack_ffffffffffffffc0);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x5627e1);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x5627eb);
  return psVar1;
}

Assistant:

statement_base *method_var::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		return new statement_var(static_cast<token_expr *>(raw.front().at(1))->get_tree(), context, false,
		                         raw.front().back());
	}